

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

int cJSON_GetArraySize(cJSON *array)

{
  int iVar1;
  cJSON *pcVar2;
  
  if (array != (cJSON *)0x0) {
    pcVar2 = (cJSON *)&array->child;
    iVar1 = -1;
    do {
      pcVar2 = pcVar2->next;
      iVar1 = iVar1 + 1;
    } while (pcVar2 != (cJSON *)0x0);
    return iVar1;
  }
  return 0;
}

Assistant:

CJSON_PUBLIC(int) cJSON_GetArraySize(const cJSON *array)
{
    cJSON *child = NULL;
    size_t size = 0;

    if (array == NULL)
    {
        return 0;
    }

    child = array->child;

    while(child != NULL)
    {
        size++;
        child = child->next;
    }

    /* FIXME: Can overflow here. Cannot be fixed without breaking the API */

    return (int)size;
}